

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketAllocator.h
# Opt level: O0

bool __thiscall
pktalloc::LightVector<siamese::EncoderSubwindow_*,_25U>::SetSize_NoCopy
          (LightVector<siamese::EncoderSubwindow_*,_25U> *this,uint elements)

{
  void *pvVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  ulong uVar4;
  void *pvVar5;
  uint in_ESI;
  void *in_RDI;
  EncoderSubwindow **oldData;
  EncoderSubwindow **newData;
  uint newAllocated;
  
  if (*(uint *)((long)in_RDI + 0xd8) < in_ESI) {
    uVar3 = in_ESI * 3 >> 1;
    auVar2 = ZEXT416(uVar3) * ZEXT816(8);
    uVar4 = auVar2._0_8_;
    if (auVar2._8_8_ != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    pvVar5 = operator_new__(uVar4,(nothrow_t *)&std::nothrow);
    if (pvVar5 == (void *)0x0) {
      return false;
    }
    pvVar1 = *(void **)((long)in_RDI + 0xd0);
    *(uint *)((long)in_RDI + 0xd8) = uVar3;
    *(void **)((long)in_RDI + 0xd0) = pvVar5;
    if ((pvVar1 != in_RDI) && (pvVar1 != (void *)0x0)) {
      operator_delete__(pvVar1);
    }
  }
  *(uint *)((long)in_RDI + 200) = in_ESI;
  return true;
}

Assistant:

bool SetSize_NoCopy(unsigned elements)
    {
        PKTALLOC_DEBUG_ASSERT(Size <= Allocated);

        // If it is actually expanding, and it needs to grow:
        if (elements > Allocated)
        {
            const unsigned newAllocated = (elements * 3) / 2;
            T* newData = new(std::nothrow) T[newAllocated];
            if (!newData)
                return false;
            T* oldData = DataPtr;
            Allocated  = newAllocated;
            DataPtr    = newData;

            // Delete old data without copying
            if (oldData != &PreallocatedData[0]) {
                delete[] oldData;
            }
        }

        Size = elements;
        return true;
    }